

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_session.cc
# Opt level: O2

bool bssl::add_session_locked(SSL_CTX *ctx,UniquePtr<SSL_SESSION> *session)

{
  SSL_SESSION *data;
  SSL_SESSION **ppSVar1;
  bool bVar2;
  int iVar3;
  pointer in_RAX;
  unsigned_long uVar4;
  size_t sVar5;
  SSL_SESSION *pSVar6;
  bool bVar7;
  SSL_SESSION *old_session;
  _Head_base<0UL,_ssl_session_st_*,_false> local_28;
  
  data = (session->_M_t).super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
         super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
         super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl;
  local_28._M_head_impl = in_RAX;
  iVar3 = lh_SSL_SESSION_insert(ctx->sessions,&local_28._M_head_impl,data);
  if (iVar3 == 0) {
LAB_0022ff07:
    bVar7 = false;
  }
  else {
    (session->_M_t).super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
    super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
    super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl = (ssl_session_st *)0x0;
    std::__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>::reset
              ((__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter> *)session,
               local_28._M_head_impl);
    if (local_28._M_head_impl != (SSL_SESSION *)0x0) {
      if (local_28._M_head_impl == data) goto LAB_0022ff07;
      SSL_SESSION_list_remove(ctx,local_28._M_head_impl);
    }
    if ((data->next != (SSL_SESSION *)0x0) && (data->prev != (SSL_SESSION *)0x0)) {
      SSL_SESSION_list_remove(ctx,data);
    }
    pSVar6 = ctx->session_cache_head;
    ppSVar1 = &pSVar6->prev;
    if (pSVar6 == (SSL_SESSION *)0x0) {
      pSVar6 = (SSL_SESSION *)&ctx->session_cache_tail;
      ppSVar1 = &ctx->session_cache_tail;
    }
    *ppSVar1 = data;
    ctx->session_cache_head = data;
    data->prev = (SSL_SESSION *)&ctx->session_cache_head;
    data->next = pSVar6;
    uVar4 = SSL_CTX_sess_get_cache_size(ctx);
    bVar7 = true;
    if (uVar4 != 0) {
      do {
        sVar5 = OPENSSL_lh_num_items((_LHASH *)ctx->sessions);
        uVar4 = SSL_CTX_sess_get_cache_size(ctx);
        if (sVar5 <= uVar4) {
          return true;
        }
        bVar2 = remove_session(ctx,ctx->session_cache_tail,false);
      } while (bVar2);
    }
  }
  return bVar7;
}

Assistant:

static bool add_session_locked(SSL_CTX *ctx, UniquePtr<SSL_SESSION> session) {
  SSL_SESSION *new_session = session.get();
  SSL_SESSION *old_session;
  if (!lh_SSL_SESSION_insert(ctx->sessions, &old_session, new_session)) {
    return false;
  }
  // |ctx->sessions| took ownership of |new_session| and gave us back a
  // reference to |old_session|. (|old_session| may be the same as
  // |new_session|, in which case we traded identical references with
  // |ctx->sessions|.)
  session.release();
  session.reset(old_session);

  if (old_session != nullptr) {
    if (old_session == new_session) {
      // |session| was already in the cache. There are no linked list pointers
      // to update.
      return false;
    }

    // There was a session ID collision. |old_session| was replaced with
    // |session| in the hash table, so |old_session| must be removed from the
    // linked list to match.
    SSL_SESSION_list_remove(ctx, old_session);
  }

  // This does not increment the reference count. Although |session| is inserted
  // into two structures (a doubly-linked list and the hash table), |ctx| only
  // takes one reference.
  SSL_SESSION_list_add(ctx, new_session);

  // Enforce any cache size limits.
  if (SSL_CTX_sess_get_cache_size(ctx) > 0) {
    while (lh_SSL_SESSION_num_items(ctx->sessions) >
           SSL_CTX_sess_get_cache_size(ctx)) {
      if (!remove_session(ctx, ctx->session_cache_tail,
                          /*lock=*/false)) {
        break;
      }
    }
  }

  return true;
}